

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *vLeaves_00;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_01;
  char *pcVar5;
  void *pvVar6;
  bool bVar7;
  int local_6c;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vRoots;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Gia_Man_t *pNew;
  int fTrimPis_local;
  int nPos_local;
  int *pPos_local;
  Gia_Man_t *p_local;
  
  vLeaves_00 = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  for (local_4c = 0; local_4c < nPos; local_4c = local_4c + 1) {
    pGVar4 = Gia_ManPo(p,pPos[local_4c]);
    Vec_PtrPush(p_00,pGVar4);
  }
  Gia_ManIncrementTravId(p);
  pGVar4 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar4);
  for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pGStack_48 = (Gia_Obj_t *)Vec_PtrEntry(p_00,local_4c);
    Gia_ManDupCones_rec(p,pGStack_48,vLeaves_00,vNodes_00,p_00);
  }
  Vec_PtrSort(vLeaves_00,Gia_ObjCompareByCioId);
  if (fTrimPis == 0) {
    local_6c = Gia_ManCiNum(p);
  }
  else {
    local_6c = Vec_PtrSize(vLeaves_00);
  }
  iVar1 = Vec_PtrSize(vNodes_00);
  iVar2 = Vec_PtrSize(p_00);
  p_01 = Gia_ManStart(local_6c + iVar1 + iVar2 + 1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar5;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  if (fTrimPis == 0) {
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar7 = false;
      if (local_4c < iVar1) {
        pGStack_48 = Gia_ManCi(p,local_4c);
        bVar7 = pGStack_48 != (Gia_Obj_t *)0x0;
      }
      iVar1 = nPos;
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(p_01);
      pGStack_48->Value = uVar3;
      local_4c = local_4c + 1;
    }
  }
  else {
    for (local_4c = 0; iVar2 = Vec_PtrSize(vLeaves_00), iVar1 = nPos, local_4c < iVar2;
        local_4c = local_4c + 1) {
      pvVar6 = Vec_PtrEntry(vLeaves_00,local_4c);
      iVar1 = Gia_ManAppendCi(p_01);
      *(int *)((long)pvVar6 + 8) = iVar1;
    }
  }
  while (local_4c = iVar1, iVar1 = Vec_PtrSize(p_00), local_4c < iVar1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(p_00,local_4c);
    uVar3 = Gia_ManAppendCi(p_01);
    pGVar4 = Gia_ObjRiToRo(p,pGVar4);
    pGVar4->Value = uVar3;
    iVar1 = local_4c + 1;
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vNodes_00,local_4c);
    iVar1 = Gia_ObjIsXor(pGVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar3 = Gia_ManAppendAnd(p_01,iVar1,iVar2);
      pGVar4->Value = uVar3;
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar3 = Gia_ManAppendXor(p_01,iVar1,iVar2);
      pGVar4->Value = uVar3;
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(p_00,local_4c);
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_01,iVar1);
  }
  iVar1 = Vec_PtrSize(p_00);
  Gia_ManSetRegNum(p_01,iVar1 - nPos);
  Vec_PtrFree(vLeaves_00);
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( (fTrimPis ? Vec_PtrSize(vLeaves) : Gia_ManCiNum(p)) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}